

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator_factory.cc
# Opt level: O1

MessageGenerator * __thiscall
google::protobuf::compiler::java::ImmutableGeneratorFactory::NewMessageGenerator
          (ImmutableGeneratorFactory *this,Descriptor *descriptor)

{
  Context *context;
  ImmutableMessageGenerator *this_00;
  
  context = this->context_;
  if (((context->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0xa0) + 0xa8) != 3)) {
    this_00 = (ImmutableMessageGenerator *)operator_new(0x40);
    ImmutableMessageGenerator::ImmutableMessageGenerator(this_00,descriptor,context);
  }
  else {
    this_00 = (ImmutableMessageGenerator *)operator_new(0x40);
    ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
              ((ImmutableMessageLiteGenerator *)this_00,descriptor,context);
  }
  return &this_00->super_MessageGenerator;
}

Assistant:

MessageGenerator* ImmutableGeneratorFactory::NewMessageGenerator(
    const Descriptor* descriptor) const {
  if (HasDescriptorMethods(descriptor, context_->EnforceLite())) {
    return new ImmutableMessageGenerator(descriptor, context_);
  } else {
    return new ImmutableMessageLiteGenerator(descriptor, context_);
  }
}